

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::symbol_codec::encode_truncated_binary(symbol_codec *this,uint v,uint n)

{
  uint num_bits;
  uint uVar1;
  ulong uVar2;
  
  num_bits = 0;
  if (1 < n) {
    num_bits = 0;
    uVar2 = (ulong)n;
    do {
      num_bits = num_bits + 1;
      uVar1 = (uint)uVar2;
      uVar2 = uVar2 >> 1;
    } while (3 < uVar1);
  }
  uVar1 = (1 << ((byte)(num_bits + 1) & 0x1f)) - n;
  if (v < uVar1) {
    encode_bits(this,v,num_bits);
    return;
  }
  encode_bits(this,uVar1 + v,num_bits + 1);
  return;
}

Assistant:

void symbol_codec::encode_truncated_binary(uint v, uint n) {
  CRNLIB_ASSERT((n >= 2) && (v < n));

  uint k = math::floor_log2i(n);
  uint u = (1 << (k + 1)) - n;

  if (v < u)
    encode_bits(v, k);
  else
    encode_bits(v + u, k + 1);
}